

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

void opj_j2k_tcp_destroy(opj_tcp_t *p_tcp)

{
  void *ptr;
  uint uVar1;
  uint uVar2;
  opj_ppx *ptr_00;
  long lVar3;
  OPJ_BYTE **ppOVar4;
  opj_mct_data_t *ptr_01;
  ulong uVar5;
  
  if (p_tcp != (opj_tcp_t *)0x0) {
    ptr_00 = p_tcp->ppt_markers;
    if (ptr_00 != (opj_ppx *)0x0) {
      uVar1 = p_tcp->ppt_markers_count;
      if (uVar1 != 0) {
        lVar3 = 0;
        uVar5 = 0;
        do {
          ptr = *(void **)((long)&p_tcp->ppt_markers->m_data + lVar3);
          if (ptr != (void *)0x0) {
            opj_free(ptr);
            uVar1 = p_tcp->ppt_markers_count;
          }
          uVar5 = uVar5 + 1;
          lVar3 = lVar3 + 0x10;
        } while (uVar5 < uVar1);
        ptr_00 = p_tcp->ppt_markers;
      }
      p_tcp->ppt_markers_count = 0;
      opj_free(ptr_00);
      p_tcp->ppt_markers = (opj_ppx *)0x0;
    }
    if (p_tcp->ppt_buffer != (OPJ_BYTE *)0x0) {
      opj_free(p_tcp->ppt_buffer);
      p_tcp->ppt_buffer = (OPJ_BYTE *)0x0;
    }
    if (p_tcp->tccps != (opj_tccp_t *)0x0) {
      opj_free(p_tcp->tccps);
      p_tcp->tccps = (opj_tccp_t *)0x0;
    }
    if (p_tcp->m_mct_coding_matrix != (OPJ_FLOAT32 *)0x0) {
      opj_free(p_tcp->m_mct_coding_matrix);
      p_tcp->m_mct_coding_matrix = (OPJ_FLOAT32 *)0x0;
    }
    if (p_tcp->m_mct_decoding_matrix != (OPJ_FLOAT32 *)0x0) {
      opj_free(p_tcp->m_mct_decoding_matrix);
      p_tcp->m_mct_decoding_matrix = (OPJ_FLOAT32 *)0x0;
    }
    if (p_tcp->m_mcc_records != (opj_simple_mcc_decorrelation_data_t *)0x0) {
      opj_free(p_tcp->m_mcc_records);
      p_tcp->m_mcc_records = (opj_simple_mcc_decorrelation_data_t *)0x0;
      p_tcp->m_nb_mcc_records = 0;
      p_tcp->m_nb_max_mcc_records = 0;
    }
    ptr_01 = p_tcp->m_mct_records;
    if (ptr_01 != (opj_mct_data_t *)0x0) {
      uVar1 = p_tcp->m_nb_mct_records;
      if (uVar1 != 0) {
        ppOVar4 = &ptr_01->m_data;
        uVar2 = 0;
        do {
          if (*ppOVar4 != (OPJ_BYTE *)0x0) {
            opj_free(*ppOVar4);
            *ppOVar4 = (OPJ_BYTE *)0x0;
            uVar1 = p_tcp->m_nb_mct_records;
          }
          uVar2 = uVar2 + 1;
          ppOVar4 = ppOVar4 + 4;
        } while (uVar2 < uVar1);
        ptr_01 = p_tcp->m_mct_records;
      }
      opj_free(ptr_01);
      p_tcp->m_mct_records = (opj_mct_data_t *)0x0;
    }
    if (p_tcp->mct_norms != (OPJ_FLOAT64 *)0x0) {
      opj_free(p_tcp->mct_norms);
      p_tcp->mct_norms = (OPJ_FLOAT64 *)0x0;
    }
    if (p_tcp->m_data != (OPJ_BYTE *)0x0) {
      opj_free(p_tcp->m_data);
      p_tcp->m_data = (OPJ_BYTE *)0x0;
      p_tcp->m_data_size = 0;
    }
  }
  return;
}

Assistant:

static void opj_j2k_tcp_destroy (opj_tcp_t *p_tcp)
{
	if (p_tcp == 00) {
		return;
	}
	
	if (p_tcp->ppt_markers != 00) {
		OPJ_UINT32 i;
		for (i = 0U; i < p_tcp->ppt_markers_count; ++i) {
			if (p_tcp->ppt_markers[i].m_data != NULL) {
				opj_free(p_tcp->ppt_markers[i].m_data);
			}
		}
		p_tcp->ppt_markers_count = 0U;
		opj_free(p_tcp->ppt_markers);
		p_tcp->ppt_markers = NULL;
	}
	
	if (p_tcp->ppt_buffer != 00) {
		opj_free(p_tcp->ppt_buffer);
		p_tcp->ppt_buffer = 00;
	}
	
	if (p_tcp->tccps != 00) {
		opj_free(p_tcp->tccps);
		p_tcp->tccps = 00;
	}
	
	if (p_tcp->m_mct_coding_matrix != 00) {
		opj_free(p_tcp->m_mct_coding_matrix);
		p_tcp->m_mct_coding_matrix = 00;
	}
	
	if (p_tcp->m_mct_decoding_matrix != 00) {
		opj_free(p_tcp->m_mct_decoding_matrix);
		p_tcp->m_mct_decoding_matrix = 00;
	}
	
	if (p_tcp->m_mcc_records) {
		opj_free(p_tcp->m_mcc_records);
		p_tcp->m_mcc_records = 00;
		p_tcp->m_nb_max_mcc_records = 0;
		p_tcp->m_nb_mcc_records = 0;
	}
	
	if (p_tcp->m_mct_records) {
		opj_mct_data_t * l_mct_data = p_tcp->m_mct_records;
		OPJ_UINT32 i;
		
		for (i=0;i<p_tcp->m_nb_mct_records;++i) {
			if (l_mct_data->m_data) {
				opj_free(l_mct_data->m_data);
				l_mct_data->m_data = 00;
			}
			
			++l_mct_data;
		}
		
		opj_free(p_tcp->m_mct_records);
		p_tcp->m_mct_records = 00;
	}

	if (p_tcp->mct_norms != 00) {
		opj_free(p_tcp->mct_norms);
		p_tcp->mct_norms = 00;
	}

	opj_j2k_tcp_data_destroy(p_tcp);

}